

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>::
moveFromSpan(Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
             *this,Span<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
                   *fromSpan,size_t fromIndex,size_t to)

{
  Entry *pEVar1;
  Entry *pEVar2;
  byte bVar3;
  uchar uVar4;
  QHttpNetworkRequest *other;
  
  uVar4 = this->nextFree;
  if (uVar4 == this->allocated) {
    addStorage(this);
    uVar4 = this->nextFree;
  }
  this->offsets[to] = uVar4;
  pEVar1 = this->entries + this->nextFree;
  this->nextFree = (pEVar1->storage).data[0];
  bVar3 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar2 = fromSpan->entries + bVar3;
  other = (QHttpNetworkRequest *)((pEVar2->storage).data + 8);
  *(undefined8 *)(pEVar1->storage).data = *(undefined8 *)(pEVar2->storage).data;
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)((pEVar1->storage).data + 8),other);
  *(undefined8 *)((pEVar1->storage).data + 0x18) = *(undefined8 *)((pEVar2->storage).data + 0x18);
  QHttpNetworkRequest::~QHttpNetworkRequest(other);
  (pEVar2->storage).data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar3;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }